

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

void tcu::lookupLine(ColorLine *dst,ConstPixelBufferAccess *level,Sampler *sampler,int x0,int x1,
                    int y)

{
  undefined8 local_40;
  undefined8 uStack_38;
  
  lookup<float>((tcu *)&local_40,level,sampler,x0,y,0);
  *(undefined8 *)(dst->p0).m_data = local_40;
  *(undefined8 *)((dst->p0).m_data + 2) = uStack_38;
  lookup<float>((tcu *)&local_40,level,sampler,x1,y,0);
  *(undefined8 *)(dst->p1).m_data = local_40;
  *(undefined8 *)((dst->p1).m_data + 2) = uStack_38;
  return;
}

Assistant:

static void lookupLine (ColorLine& dst, const ConstPixelBufferAccess& level, const Sampler& sampler, int x0, int x1, int y)
{
	dst.p0 = lookup<float>(level, sampler, x0, y, 0);
	dst.p1 = lookup<float>(level, sampler, x1, y, 0);
}